

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ProgressCheck(Parse *p)

{
  sqlite3 *psVar1;
  uint uVar2;
  int iVar3;
  sqlite3 *db;
  Parse *p_local;
  
  psVar1 = p->db;
  if ((psVar1->u1).isInterrupted != 0) {
    p->nErr = p->nErr + 1;
    p->rc = 9;
  }
  if (psVar1->xProgress != (_func_int_void_ptr *)0x0) {
    if (p->rc == 9) {
      p->nProgressSteps = 0;
    }
    else {
      uVar2 = p->nProgressSteps + 1;
      p->nProgressSteps = uVar2;
      if (psVar1->nProgressOps <= uVar2) {
        iVar3 = (*psVar1->xProgress)(psVar1->pProgressArg);
        if (iVar3 != 0) {
          p->nErr = p->nErr + 1;
          p->rc = 9;
        }
        p->nProgressSteps = 0;
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ProgressCheck(Parse *p){
  sqlite3 *db = p->db;
  if( AtomicLoad(&db->u1.isInterrupted) ){
    p->nErr++;
    p->rc = SQLITE_INTERRUPT;
  }
#ifndef SQLITE_OMIT_PROGRESS_CALLBACK
  if( db->xProgress ){
    if( p->rc==SQLITE_INTERRUPT ){
      p->nProgressSteps = 0;
    }else if( (++p->nProgressSteps)>=db->nProgressOps ){
      if( db->xProgress(db->pProgressArg) ){
        p->nErr++;
        p->rc = SQLITE_INTERRUPT;
      }
      p->nProgressSteps = 0;
    }
  }
#endif
}